

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenBinarySetLeft(BinaryenExpressionRef expr,BinaryenExpressionRef leftExpr)

{
  if (expr->_id != BinaryId) {
    __assert_fail("expression->is<Binary>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xb2f,"void BinaryenBinarySetLeft(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (leftExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)leftExpr;
    return;
  }
  __assert_fail("leftExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xb30,"void BinaryenBinarySetLeft(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenBinarySetLeft(BinaryenExpressionRef expr,
                           BinaryenExpressionRef leftExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Binary>());
  assert(leftExpr);
  static_cast<Binary*>(expression)->left = (Expression*)leftExpr;
}